

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall wabt::SharedValidator::OnThrow(SharedValidator *this,Location *loc,Var *tag_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  TagType tag_type;
  Var local_70;
  
  RVar1 = CheckInstr(this,(Opcode)0x8,loc);
  tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Var::Var(&local_70,tag_var);
  RVar2 = CheckTagIndex(this,&local_70,&tag_type);
  Var::~Var(&local_70);
  RVar3 = TypeChecker::OnThrow(&this->typechecker_,&tag_type.params);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&tag_type);
  return (Result)(uint)(RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
}

Assistant:

Result SharedValidator::OnThrow(const Location& loc, Var tag_var) {
  Result result = CheckInstr(Opcode::Throw, loc);
  TagType tag_type;
  result |= CheckTagIndex(tag_var, &tag_type);
  result |= typechecker_.OnThrow(tag_type.params);
  return result;
}